

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

void __thiscall sf::priv::WindowImplX11::processEvents(WindowImplX11 *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  XEvent nextEvent;
  XEvent local_1b0;
  int local_f0 [14];
  ulong local_b8;
  uint local_9c;
  
  iVar3 = XCheckIfEvent(this->m_display,&local_1b0,
                        anon_unknown.dwarf_5b9478::WindowsImplX11Impl::checkEvent,this->m_window);
  if (iVar3 != 0) {
    bVar4 = true;
LAB_001e7a62:
    do {
      bVar2 = bVar4;
      if (local_1b0.type == 3) {
        iVar3 = XCheckIfEvent(this->m_display,local_f0,
                              anon_unknown.dwarf_5b9478::WindowsImplX11Impl::checkEvent,
                              this->m_window);
        if (iVar3 == 0) {
          bVar1 = false;
        }
        else {
          if (((local_f0[0] == 2) && (local_9c == local_1b0.xkey.keycode)) &&
             (local_b8 <= local_1b0.xkey.time + 1 && (ulong)local_1b0._56_8_ <= local_b8)) {
            bVar1 = false;
            bVar2 = false;
            if (this->m_keyRepeat == false) goto LAB_001e7ae8;
          }
          else {
            processEvent(this,&local_1b0);
            bVar2 = true;
          }
          bVar1 = bVar2;
          memcpy(&local_1b0,local_f0,0xc0);
          bVar2 = bVar4;
        }
LAB_001e7ae8:
        bVar4 = bVar2;
        if (bVar1) goto LAB_001e7a62;
      }
      if (bVar2) {
        processEvent(this,&local_1b0);
      }
      iVar3 = XCheckIfEvent(this->m_display,&local_1b0,
                            anon_unknown.dwarf_5b9478::WindowsImplX11Impl::checkEvent,this->m_window
                           );
      bVar4 = true;
    } while (iVar3 != 0);
  }
  ClipboardImpl::processEvents();
  return;
}

Assistant:

void WindowImplX11::processEvents()
{
    using namespace WindowsImplX11Impl;

    XEvent event;

    // Pick out the events that are interesting for this window
    while (XCheckIfEvent(m_display, &event, &checkEvent, reinterpret_cast<XPointer>(m_window)))
    {
        // This function implements a workaround to properly discard
        // repeated key events when necessary. The problem is that the
        // system's key events policy doesn't match SFML's one: X server will generate
        // both repeated KeyPress and KeyRelease events when maintaining a key down, while
        // SFML only wants repeated KeyPress events. Thus, we have to:
        // - Discard duplicated KeyRelease events when m_keyRepeat is true
        // - Discard both duplicated KeyPress and KeyRelease events when m_keyRepeat is false

        bool processThisEvent = true;

        // Detect repeated key events
        while (event.type == KeyRelease)
        {
            XEvent nextEvent;
            if (XCheckIfEvent(m_display, &nextEvent, checkEvent, reinterpret_cast<XPointer>(m_window)))
            {
                if ((nextEvent.type == KeyPress) && (nextEvent.xkey.keycode == event.xkey.keycode) &&
                    (event.xkey.time <= nextEvent.xkey.time) && (nextEvent.xkey.time <= event.xkey.time + 1))
                {
                    // This sequence of events comes from maintaining a key down
                    if (m_keyRepeat)
                    {
                        // Ignore the KeyRelease event and process the KeyPress event
                        event = nextEvent;
                        break;
                    }
                    else
                    {
                        // Ignore both events
                        processThisEvent = false;
                        break;
                    }
                }
                else
                {
                    // This sequence of events does not come from maintaining a key down,
                    // so process the KeyRelease event normally,
                    processEvent(event);
                    // but loop because the next event can be the first half
                    // of a sequence coming from maintaining a key down.
                    event = nextEvent;
                }
            }
            else
            {
                // No event after this KeyRelease event so assume it can be processed.
                break;
            }
        }

        if (processThisEvent)
        {
            processEvent(event);
        }
    }

    // Process clipboard window events
    priv::ClipboardImpl::processEvents();
}